

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

double __thiscall Matrix<double,_3,_1>::norm(Matrix<double,_3,_1> *this)

{
  int iVar1;
  double *pdVar2;
  int i;
  int row;
  int j;
  int iVar3;
  double dVar4;
  double local_28;
  
  iVar3 = this->rows;
  local_28 = -1.0;
  if (0 < iVar3) {
    iVar1 = this->cols;
    if (0 < iVar1) {
      local_28 = 0.0;
      for (row = 0; row < iVar3; row = row + 1) {
        for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
          pdVar2 = operator()(this,row,iVar3);
          dVar4 = *pdVar2;
          pdVar2 = operator()(this,row,iVar3);
          local_28 = local_28 + dVar4 * *pdVar2;
          iVar1 = this->cols;
        }
        iVar3 = this->rows;
      }
      if (local_28 < 0.0) {
        dVar4 = sqrt(local_28);
        return dVar4;
      }
      local_28 = SQRT(local_28);
    }
  }
  return local_28;
}

Assistant:

double Matrix<T, _0, _1>::norm()
{
    if(this->rows <= 0 || this->cols <= 0)
        return -1;
    double sum = 0;
    for(int i = 0; i < rows; ++i)
        for(int j = 0; j < cols; ++j)
            sum += this->operator()(i, j) * this->operator()(i, j);
    return sqrt(sum);
}